

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O1

QString * __thiscall QtCbor::ByteData::toUtf8String(QString *__return_storage_ptr__,ByteData *this)

{
  QString *pQVar1;
  QString *this_00;
  storage_type *in_RCX;
  QByteArrayView ba;
  
  pQVar1 = (QString *)this->len;
  this_00 = (QString *)0x0;
  if (0 < (long)pQVar1) {
    this_00 = pQVar1;
  }
  if ((long)pQVar1 < 0) {
    this_00 = (QString *)strlen((char *)(this + 1));
  }
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)(this + 1);
  QString::fromUtf8(__return_storage_ptr__,this_00,ba);
  return __return_storage_ptr__;
}

Assistant:

QString toUtf8String() const    { return QString::fromUtf8(byte(), len); }